

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_event_trigger.c
# Opt level: O3

void * event_trigger_thread(void *param)

{
  pthread_cond_t *__cond;
  pthread_mutex_t *__mutex;
  int *piVar1;
  __time_t _Var2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  timeval curr_time;
  timespec final_time;
  timeval local_60;
  timeval local_50;
  timespec local_40;
  
  gettimeofday(&local_60,(__timezone_ptr_t)0x0);
  _Var2 = local_60.tv_sec;
  lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_usec),8);
  __cond = (pthread_cond_t *)((long)param + 0x10);
  iVar3 = pthread_cond_init(__cond,(pthread_condattr_t *)0x0);
  if ((iVar3 == 0) &&
     (iVar3 = pthread_mutex_init((pthread_mutex_t *)((long)param + 0x40),(pthread_mutexattr_t *)0x0)
     , iVar3 == 0)) {
    *(undefined4 *)((long)param + 0x68) = *(undefined4 *)(*(long *)((long)param + 0x80) + 8);
    _mpp_log_l(4,0,"with %u\n","event_create");
  }
  __mutex = (pthread_mutex_t *)((long)param + 0x40);
  while( true ) {
    iVar3 = *(int *)((long)param + 0x68);
    bVar8 = false;
    gettimeofday(&local_50,(__timezone_ptr_t)0x0);
    lVar6 = (ulong)(uint)(iVar3 * 10000000) + local_50.tv_usec;
    local_40.tv_sec = lVar6 / 1000000 + local_50.tv_sec;
    local_40.tv_nsec = (lVar6 % 1000000) * 1000;
    pthread_mutex_lock(__mutex);
    if (*(int *)((long)param + 0x68) != 0) {
      do {
        iVar4 = pthread_cond_timedwait(__cond,__mutex,&local_40);
        iVar3 = *(int *)((long)param + 0x68);
        if (iVar4 != 0) {
          iVar3 = iVar3 + -1;
          *(int *)((long)param + 0x68) = iVar3;
        }
      } while (iVar3 != 0);
      bVar8 = iVar4 == 0x6e;
    }
    *(undefined4 *)((long)param + 0x68) = 0xffffffff;
    pthread_mutex_unlock(__mutex);
    if (*(int *)((long)param + 0x78) == 0) goto LAB_00105eab;
    if (bVar8) break;
    gettimeofday(&local_60,(__timezone_ptr_t)0x0);
    _mpp_log_l(4,0,"[%ld ms] event idx %d triggered\n",0,
               (local_60.tv_sec - _Var2) * 1000 +
               local_60.tv_usec / 1000 + ((lVar5 >> 7) - (lVar5 >> 0x3f)),
               *(undefined4 *)((long)param + 0x88));
    _mpp_log_l(4,0,"cnt %d\n",0,**(undefined4 **)((long)param + 0x80));
    (**(code **)((long)param + 8))
              (*(undefined8 *)((long)param + 0x90),
               *(undefined8 *)
                (*(int **)((long)param + 0x80) +
                (long)(*(int *)((long)param + 0x88) % **(int **)((long)param + 0x80)) * 4 + 4));
    pthread_mutex_lock(__mutex);
    piVar1 = *(int **)((long)param + 0x80);
    iVar3 = *piVar1;
    lVar7 = (long)(*(int *)((long)param + 0x88) % iVar3);
    iVar4 = *(int *)((long)param + 0x88) + 1;
    *(int *)((long)param + 0x88) = iVar4;
    lVar6 = (long)(iVar4 % iVar3);
    _mpp_log_l(4,0,"curr %d, next %d\n",0,piVar1[lVar7 * 4 + 2],piVar1[lVar6 * 4 + 2]);
    iVar3 = piVar1[lVar6 * 4 + 2] - piVar1[lVar7 * 4 + 2];
    if (iVar3 == 0 || piVar1[lVar6 * 4 + 2] < piVar1[lVar7 * 4 + 2]) {
      iVar4 = *(int *)(*(long *)((long)param + 0x80) + 4);
      if (0 < iVar4) {
        iVar3 = iVar3 + iVar4;
        goto LAB_00105e53;
      }
      *(undefined4 *)((long)param + 0x78) = 0;
      iVar3 = *(int *)((long)param + 0x68);
    }
    else {
LAB_00105e53:
      *(int *)((long)param + 0x68) = iVar3;
    }
    _mpp_log_l(4,0,"semval %u\n","event_init",iVar3);
    pthread_mutex_unlock(__mutex);
    if (*(int *)((long)param + 0x78) == 0) {
LAB_00105eab:
      pthread_cond_destroy(__cond);
      pthread_mutex_destroy(__mutex);
      _mpp_log_l(4,0,"exit\n","event_trigger_thread");
      return (void *)0x0;
    }
  }
  _mpp_log_l(2,0,"wait event timeout\n",0);
  goto LAB_00105eab;
}

Assistant:

static void *event_trigger_thread(void *param)
{
    struct event_ctx_impl *ctx = (struct event_ctx_impl *)param;
    struct timeval curr_time;
    long start_time, curr;
    RK_S32 ret;

    gettimeofday(&curr_time, NULL);

    start_time = curr_time.tv_sec * 1000 + curr_time.tv_usec / 1000;
    event_create(ctx);

    while (1) {
        ret = event_timed_wait(ctx, ctx->semval * 10000);
        if (!ctx->flag)
            break;

        if (ret == ETIMEDOUT) {
            mpp_err("wait event timeout\n");
            break;
        }

        gettimeofday(&curr_time, NULL);

        curr = curr_time.tv_sec * 1000 + curr_time.tv_usec / 1000;
        /* TODO, trigger event */
        mpp_log("[%ld ms] event idx %d triggered\n",
                curr - start_time, ctx->event_idx);
        mpp_log("cnt %d\n", ctx->ea->cnt);
        ctx->trigger(ctx->parent, ctx->ea->e[ctx->event_idx % ctx->ea->cnt].event);

        /* schedule next event */
        event_init(ctx);
        if (!ctx->flag)
            break;
    }

    event_destroy(ctx);

    mpp_log_f("exit\n");

    return NULL;
}